

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

Char * Diligent::GetFillModeLiteralName(FILL_MODE FillMode)

{
  Char *pCVar1;
  char (*in_R8) [2];
  string msg;
  int local_2c;
  string local_28;
  
  if (FillMode < FILL_MODE_NUM_MODES) {
    pCVar1 = &DAT_006696cc + *(int *)(&DAT_006696cc + (ulong)FillMode * 4);
  }
  else {
    local_2c = (int)(char)FillMode;
    FormatString<char[23],int,char[2]>
              (&local_28,(Diligent *)"Unexpected fill mode (",(char (*) [23])&local_2c,
               (int *)0x647201,in_R8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetFillModeLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x416);
    std::__cxx11::string::~string((string *)&local_28);
    pCVar1 = "UNKNOWN";
  }
  return pCVar1;
}

Assistant:

const Char* GetFillModeLiteralName(FILL_MODE FillMode)
{
#define FILL_MODE_TO_STR(Mode) \
    case Mode: return #Mode

    static_assert(FILL_MODE_NUM_MODES == 3, "Please update the switch below to handle the new filter mode");
    switch (FillMode)
    {
        FILL_MODE_TO_STR(FILL_MODE_UNDEFINED);
        FILL_MODE_TO_STR(FILL_MODE_WIREFRAME);
        FILL_MODE_TO_STR(FILL_MODE_SOLID);

        default:
            UNEXPECTED("Unexpected fill mode (", static_cast<int>(FillMode), ")");
            return "UNKNOWN";
    }
#undef FILL_MODE_TO_STR
}